

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O1

tss_data_node * boost::detail::find_tss_data(void *key)

{
  thread_data_base *ptVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  
  ptVar1 = get_current_thread_data();
  if (ptVar1 != (thread_data_base *)0x0) {
    p_Var2 = &(ptVar1->tss_data)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = (ptVar1->tss_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &p_Var2->_M_header;
    for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(void **)(p_Var3 + 1) < key]) {
      if (*(void **)(p_Var3 + 1) >= key) {
        p_Var4 = p_Var3;
      }
    }
    p_Var3 = &p_Var2->_M_header;
    if (((_Rb_tree_header *)p_Var4 != p_Var2) && (p_Var3 = p_Var4, key < *(void **)(p_Var4 + 1))) {
      p_Var3 = &p_Var2->_M_header;
    }
    if ((_Rb_tree_header *)p_Var3 != p_Var2) {
      return (tss_data_node *)&p_Var3[1]._M_parent;
    }
  }
  return (tss_data_node *)0x0;
}

Assistant:

tss_data_node* find_tss_data(void const* key)
        {
            detail::thread_data_base* const current_thread_data(get_current_thread_data());
            if(current_thread_data)
            {
                std::map<void const*,tss_data_node>::iterator current_node=
                    current_thread_data->tss_data.find(key);
                if(current_node!=current_thread_data->tss_data.end())
                {
                    return &current_node->second;
                }
            }
            return 0;
        }